

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

void __thiscall
tchecker::typed_sequence_statement_t::typed_sequence_statement_t
          (typed_sequence_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_statement_t> *first,
          shared_ptr<const_tchecker::typed_statement_t> *second)

{
  shared_ptr<const_tchecker::statement_t> local_48;
  shared_ptr<const_tchecker::statement_t> local_38;
  shared_ptr<const_tchecker::typed_statement_t> *local_28;
  shared_ptr<const_tchecker::typed_statement_t> *second_local;
  shared_ptr<const_tchecker::typed_statement_t> *first_local;
  typed_sequence_statement_t *ptStack_10;
  statement_type_t type_local;
  typed_sequence_statement_t *this_local;
  
  local_28 = second;
  second_local = first;
  first_local._4_4_ = type;
  ptStack_10 = this;
  statement_t::statement_t((statement_t *)this);
  typed_statement_t::typed_statement_t
            (&this->super_typed_statement_t,&PTR_PTR_003490a8,first_local._4_4_);
  std::shared_ptr<tchecker::statement_t_const>::shared_ptr<tchecker::typed_statement_t_const,void>
            ((shared_ptr<tchecker::statement_t_const> *)&local_38,second_local);
  std::shared_ptr<tchecker::statement_t_const>::shared_ptr<tchecker::typed_statement_t_const,void>
            ((shared_ptr<tchecker::statement_t_const> *)&local_48,local_28);
  sequence_statement_t::sequence_statement_t
            (&this->super_sequence_statement_t,&PTR_construction_vtable_56__003490b8,&local_38,
             &local_48);
  std::shared_ptr<const_tchecker::statement_t>::~shared_ptr(&local_48);
  std::shared_ptr<const_tchecker::statement_t>::~shared_ptr(&local_38);
  *(undefined8 *)&this->super_typed_statement_t = 0x349000;
  *(undefined8 *)&this->super_typed_statement_t = 0x349000;
  *(undefined8 *)&this->super_sequence_statement_t = 0x349070;
  return;
}

Assistant:

typed_sequence_statement_t::typed_sequence_statement_t(enum tchecker::statement_type_t type,
                                                       std::shared_ptr<tchecker::typed_statement_t const> const & first,
                                                       std::shared_ptr<tchecker::typed_statement_t const> const & second)
    : tchecker::typed_statement_t(type), tchecker::sequence_statement_t(first, second)
{
}